

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaTime GetStreamTime(PaStream *s)

{
  long lVar1;
  size_t __n;
  void *__s;
  long lVar2;
  undefined8 uStack_30;
  long local_28;
  snd_timestamp_t timestamp;
  
  uStack_30 = 0x10e25c;
  __n = snd_pcm_status_sizeof();
  lVar1 = -(__n + 0xf & 0xfffffffffffffff0);
  __s = (void *)((long)&local_28 + lVar1);
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x10e27a;
  memset(__s,0,__n);
  lVar2 = *(long *)((long)s + 0x2c0);
  if ((lVar2 != 0) || (lVar2 = *(long *)((long)s + 0x340), lVar2 != 0)) {
    *(undefined8 *)((long)&uStack_30 + lVar1) = 0x10e29a;
    snd_pcm_status(lVar2,__s);
  }
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x10e2a9;
  snd_pcm_status_get_tstamp(__s,&local_28);
  return (double)timestamp.tv_sec / 1000000.0 + (double)local_28;
}

Assistant:

static PaTime GetStreamTime( PaStream *s )
{
    PaAlsaStream *stream = (PaAlsaStream*)s;

    snd_timestamp_t timestamp;
    snd_pcm_status_t* status;
    alsa_snd_pcm_status_alloca( &status );

    /* TODO: what if we have both?  does it really matter? */

    /* TODO: if running in callback mode, this will mean
     * libasound routines are being called from multiple threads.
     * need to verify that libasound is thread-safe. */

    if( stream->capture.pcm )
    {
        alsa_snd_pcm_status( stream->capture.pcm, status );
    }
    else if( stream->playback.pcm )
    {
        alsa_snd_pcm_status( stream->playback.pcm, status );
    }

    alsa_snd_pcm_status_get_tstamp( status, &timestamp );
    return timestamp.tv_sec + (PaTime)timestamp.tv_usec / 1e6;
}